

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O0

bool amrex::VisMF::Check(string *mf_name)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  Long LVar7;
  string *in_RDI;
  ifstream ifs_1;
  string FullName;
  FabOnDisk *fod;
  bool badFab;
  int i;
  ifstream ifs;
  string FullHdrFileName;
  Header hdr;
  int nBadFabs;
  char c;
  int v1;
  int isOk;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffedb8;
  Print *in_stack_ffffffffffffedc0;
  undefined8 in_stack_ffffffffffffedc8;
  BoxArray *in_stack_ffffffffffffedd0;
  ostream *in_stack_ffffffffffffede8;
  Print *in_stack_ffffffffffffedf0;
  Header *in_stack_ffffffffffffee00;
  Header *in_stack_ffffffffffffee08;
  istream *in_stack_ffffffffffffee10;
  Print *in_stack_ffffffffffffee28;
  Print *in_stack_ffffffffffffee30;
  istream local_a78 [520];
  string local_870 [32];
  FabOnDisk *local_850;
  byte local_845;
  int local_844;
  string local_6b8 [32];
  Long local_698;
  Long local_690;
  undefined1 local_500 [520];
  string local_2f8 [32];
  int local_2d8;
  int local_1ac;
  char local_1a5 [405];
  int local_10;
  int local_c;
  string *local_8;
  
  local_c = 1;
  local_10 = 1;
  local_8 = in_RDI;
  bVar1 = ParallelDescriptor::IOProcessor();
  if (bVar1) {
    if (verbose != 0) {
      OutStream();
      Print::Print(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [50])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,
                        (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                         *)in_stack_ffffffffffffedb8);
      Print::~Print(in_stack_ffffffffffffee30);
    }
    local_1ac = 0;
    Header::Header(in_stack_ffffffffffffee00);
    std::__cxx11::string::string(local_2f8,local_8);
    std::__cxx11::string::operator+=(local_2f8,TheMultiFabHdrFileSuffix);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(local_500,pcVar5,_S_in);
    amrex::operator>>(in_stack_ffffffffffffee10,in_stack_ffffffffffffee08);
    std::ifstream::close();
    std::ifstream::~ifstream(local_500);
    if (verbose != 0) {
      OutStream();
      Print::Print(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [16])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(int *)in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [2])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [22])in_stack_ffffffffffffedb8);
      local_690 = BoxArray::size((BoxArray *)0xf8254a);
      Print::operator<<(in_stack_ffffffffffffedc0,(long *)in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [2])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [13])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(int *)in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [2])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [27])in_stack_ffffffffffffedb8);
      local_698 = Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::size
                            ((Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                              *)0xf82615);
      Print::operator<<(in_stack_ffffffffffffedc0,(long *)in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [2])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [11])in_stack_ffffffffffffedb8);
      DirName((string *)in_stack_ffffffffffffee28);
      Print::operator<<(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [2])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [11])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [2])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [19])in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [2])in_stack_ffffffffffffedb8);
      std::__cxx11::string::~string(local_6b8);
      Print::~Print(in_stack_ffffffffffffee30);
    }
    if (local_2d8 == 1) {
      for (local_844 = 0; lVar6 = (long)local_844,
          LVar7 = Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::size
                            ((Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                              *)0xf82923), lVar6 < LVar7; local_844 = local_844 + 1) {
        local_845 = 0;
        local_850 = Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>::
                    operator[]((Vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                                *)in_stack_ffffffffffffedc0,(size_type)in_stack_ffffffffffffedb8);
        DirName((string *)in_stack_ffffffffffffee28);
        std::__cxx11::string::operator+=(local_870,(string *)local_850);
        std::ifstream::ifstream(local_a78);
        _Var3 = std::__cxx11::string::c_str();
        std::operator|(_S_in,_S_bin);
        std::ifstream::open((char *)local_a78,_Var3);
        bVar2 = std::ios::good();
        if ((bVar2 & 1) == 0) {
          if (verbose != 0) {
            OutStream();
            AllPrint::AllPrint((AllPrint *)in_stack_ffffffffffffedc0,
                               (ostream *)in_stack_ffffffffffffedb8);
            Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [36])in_stack_ffffffffffffedb8);
            Print::operator<<(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
            Print::operator<<(in_stack_ffffffffffffedc0,
                              (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                               *)in_stack_ffffffffffffedb8);
            AllPrint::~AllPrint((AllPrint *)0xf82aaa);
          }
        }
        else {
          std::istream::seekg((long)local_a78,(_Ios_Seekdir)local_850->m_head);
          std::operator>>(local_a78,local_1a5);
          if (local_1a5[0] != 'F') {
            local_845 = 1;
          }
          std::operator>>(local_a78,local_1a5);
          if (local_1a5[0] != 'A') {
            local_845 = 1;
          }
          std::operator>>(local_a78,local_1a5);
          if (local_1a5[0] != 'B') {
            local_845 = 1;
          }
          if (((local_845 & 1) != 0) && (local_1ac = local_1ac + 1, verbose != 0)) {
            OutStream();
            AllPrint::AllPrint((AllPrint *)in_stack_ffffffffffffedc0,
                               (ostream *)in_stack_ffffffffffffedb8);
            in_stack_ffffffffffffee28 =
                 Print::operator<<(in_stack_ffffffffffffedc0,
                                   (char (*) [22])in_stack_ffffffffffffedb8);
            Print::operator<<(in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
            Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [22])in_stack_ffffffffffffedb8);
            Print::operator<<(in_stack_ffffffffffffedc0,(int *)in_stack_ffffffffffffedb8);
            Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [13])in_stack_ffffffffffffedb8);
            Print::operator<<(in_stack_ffffffffffffedc0,(long *)in_stack_ffffffffffffedb8);
            Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [9])in_stack_ffffffffffffedb8);
            BoxArray::operator[]
                      (in_stack_ffffffffffffedd0,(int)((ulong)in_stack_ffffffffffffedc8 >> 0x20));
            Print::operator<<(in_stack_ffffffffffffedc0,(Box *)in_stack_ffffffffffffedb8);
            Print::operator<<(in_stack_ffffffffffffedc0,
                              (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                               *)in_stack_ffffffffffffedb8);
            AllPrint::~AllPrint((AllPrint *)0xf82d0a);
          }
          std::ifstream::close();
        }
        std::ifstream::~ifstream(local_a78);
        std::__cxx11::string::~string(local_870);
      }
      if (local_1ac == 0) {
        if (verbose != 0) {
          OutStream();
          AllPrint::AllPrint((AllPrint *)in_stack_ffffffffffffedc0,
                             (ostream *)in_stack_ffffffffffffedb8);
          in_stack_ffffffffffffedc0 =
               Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [13])in_stack_ffffffffffffedb8)
          ;
          Print::operator<<(in_stack_ffffffffffffedc0,
                            (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                             *)in_stack_ffffffffffffedb8);
          AllPrint::~AllPrint((AllPrint *)0xf82eda);
        }
        local_c = 1;
      }
      else {
        if (verbose != 0) {
          OutStream();
          AllPrint::AllPrint((AllPrint *)in_stack_ffffffffffffedc0,
                             (ostream *)in_stack_ffffffffffffedb8);
          Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [18])in_stack_ffffffffffffedb8);
          Print::operator<<(in_stack_ffffffffffffedc0,(int *)in_stack_ffffffffffffedb8);
          Print::operator<<(in_stack_ffffffffffffedc0,
                            (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                             *)in_stack_ffffffffffffedb8);
          AllPrint::~AllPrint((AllPrint *)0xf82e3a);
        }
        local_c = 0;
      }
    }
    else {
      local_10 = 0;
      if (verbose != 0) {
        OutStream();
        Print::Print(in_stack_ffffffffffffedf0,in_stack_ffffffffffffede8);
        Print::operator<<(in_stack_ffffffffffffedc0,(char (*) [54])in_stack_ffffffffffffedb8);
        Print::operator<<(in_stack_ffffffffffffedc0,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)in_stack_ffffffffffffedb8);
        Print::~Print(in_stack_ffffffffffffee30);
      }
    }
    std::__cxx11::string::~string(local_2f8);
    Header::~Header((Header *)in_stack_ffffffffffffedc0);
  }
  iVar4 = ParallelDescriptor::IOProcessorNumber();
  ParallelDescriptor::Bcast<int>(&local_c,1,iVar4);
  iVar4 = ParallelDescriptor::IOProcessorNumber();
  ParallelDescriptor::Bcast<int>(&local_10,1,iVar4);
  return local_c != 0;
}

Assistant:

bool
VisMF::Check (const std::string& mf_name)
{
//  BL_PROFILE("VisMF::Check()");

  int isOk(true);  // ---- int to broadcast
  int v1(true);

  if(ParallelDescriptor::IOProcessor()) {
   if (verbose) {
       amrex::Print() << "---------------- VisMF::Check:  about to check:  " << mf_name << std::endl;
   }

    char c;
    int nBadFabs(0);
    VisMF::Header hdr;
    std::string FullHdrFileName(mf_name);
    FullHdrFileName += TheMultiFabHdrFileSuffix;

    {
        std::ifstream ifs(FullHdrFileName.c_str());
        ifs >> hdr;
        ifs.close();
    }

    if (verbose) {
        amrex::Print() << "hdr.version =  " << hdr.m_vers << "\n"
                       << "hdr.boxarray size =  " << hdr.m_ba.size() << "\n"
                       << "mf.ncomp =  " << hdr.m_ncomp << "\n"
                       << "number of fabs on disk =  " << hdr.m_fod.size() << "\n"
                       << "DirName = " << DirName(mf_name) << "\n"
                       << "mf_name = " << mf_name << "\n"
                       << "FullHdrFileName = " << FullHdrFileName << "\n";
    }

    if(hdr.m_vers != VisMF::Header::Version_v1) {
     v1 = false;
     if (verbose) {
         amrex::Print() << "**** VisMF::Check currently only supports Version_v1." << std::endl;
     }
    } else {

    // check that the string FAB is where it should be
    for(int i(0); i < hdr.m_fod.size(); ++i) {
      bool badFab(false);
      FabOnDisk &fod = hdr.m_fod[i];
      std::string FullName(VisMF::DirName(mf_name));
      FullName += fod.m_name;
      std::ifstream ifs;
      ifs.open(FullName.c_str(), std::ios::in|std::ios::binary);

      if( ! ifs.good()) {
          if (verbose) {
              amrex::AllPrint() << "**** Error:  could not open file:  " << FullName << std::endl;
          }
          continue;
      }

      ifs.seekg(fod.m_head, std::ios::beg);

      ifs >> c;
      if(c != 'F') {
        badFab = true;
      }
      ifs >> c;
      if(c != 'A') {
        badFab = true;
      }
      ifs >> c;
      if(c != 'B') {
        badFab = true;
      }
      if(badFab) {
        ++nBadFabs;
        if (verbose) {
            amrex::AllPrint() << "**** Error in file:  " << FullName << "  Bad Fab at index = "
                              << i << "  seekpos = " << fod.m_head << "  box = " << hdr.m_ba[i]
                              << std::endl;
        }
      }
      ifs.close();

    }
    if(nBadFabs) {
        if (verbose) {
            amrex::AllPrint() << "Total Bad Fabs = " << nBadFabs << std::endl;
        }
        isOk = false;
    } else {
        if (verbose) {
            amrex::AllPrint() << "No Bad Fabs." << std::endl;
        }
        isOk = true;
    }
    }

  }
  ParallelDescriptor::Bcast(&isOk, 1, ParallelDescriptor::IOProcessorNumber());
  ParallelDescriptor::Bcast(&v1,  1, ParallelDescriptor::IOProcessorNumber());

  return isOk;

}